

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

bool test_match_object(Am_Object *object,Am_Value_List *slots_and_values_used)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object proto;
  Am_Value local_70;
  undefined1 local_60 [8];
  Am_Value target_v;
  Am_Value object_v;
  Am_Am_Slot_Key local_2a;
  Am_Am_Slot_Key key;
  Am_Assoc as;
  Am_Value_List *slots_and_values_used_local;
  Am_Object *object_local;
  
  Am_Assoc::Am_Assoc((Am_Assoc *)&stack0xffffffffffffffd8);
  Am_Am_Slot_Key::Am_Am_Slot_Key(&local_2a,0);
  Am_Value::Am_Value((Am_Value *)&target_v.value);
  Am_Value::Am_Value((Am_Value *)local_60);
  Am_Value_List::Start(slots_and_values_used);
  do {
    bVar1 = Am_Value_List::Last(slots_and_values_used);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      object_local._7_1_ = 1;
LAB_002ca71f:
      Am_Value::~Am_Value((Am_Value *)local_60);
      Am_Value::~Am_Value((Am_Value *)&target_v.value);
      Am_Assoc::~Am_Assoc((Am_Assoc *)&stack0xffffffffffffffd8);
      return (bool)(object_local._7_1_ & 1);
    }
    pAVar3 = Am_Value_List::Get(slots_and_values_used);
    Am_Assoc::operator=((Am_Assoc *)&stack0xffffffffffffffd8,pAVar3);
    Am_Assoc::Value_1((Am_Assoc *)&local_70);
    Am_Am_Slot_Key::operator=(&local_2a,&local_70);
    Am_Value::~Am_Value(&local_70);
    Am_Assoc::Value_2((Am_Assoc *)&proto);
    Am_Value::operator=((Am_Value *)local_60,(Am_Value *)&proto);
    Am_Value::~Am_Value((Am_Value *)&proto);
    AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short(&local_2a);
    if (AVar2 == 0xb) {
      Am_Object::Am_Object(&local_88,(Am_Value *)local_60);
      Am_Object::Am_Object(&local_90,&local_88);
      bVar1 = Am_Object::Is_Instance_Of(object,&local_90);
      Am_Object::~Am_Object(&local_90);
      bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
      if (bVar1) {
        object_local._7_1_ = 0;
      }
      Am_Object::~Am_Object(&local_88);
      if (bVar1) goto LAB_002ca71f;
    }
    else {
      AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short(&local_2a);
      pAVar3 = Am_Object::Peek(object,AVar2,0);
      Am_Value::operator=((Am_Value *)&target_v.value,pAVar3);
      bVar1 = Am_Value::Exists((Am_Value *)&target_v.value);
      if ((!bVar1) ||
         (bVar1 = Am_Value::operator!=((Am_Value *)&target_v.value,(Am_Value *)local_60), bVar1)) {
        object_local._7_1_ = 0;
        goto LAB_002ca71f;
      }
    }
    Am_Value_List::Next(slots_and_values_used);
  } while( true );
}

Assistant:

bool
test_match_object(Am_Object &object, Am_Value_List &slots_and_values_used)
{
  Am_Assoc as;
  Am_Am_Slot_Key key;
  Am_Value object_v, target_v;
  for (slots_and_values_used.Start(); !slots_and_values_used.Last();
       slots_and_values_used.Next()) {
    as = slots_and_values_used.Get();
    key = as.Value_1();
    target_v = as.Value_2();
    if ((Am_Slot_Key)key == Am_PROTOTYPE) {
      Am_Object proto = target_v;
      if (!object.Is_Instance_Of(proto)) {
        return false;
      }
    } else {
      object_v = object.Peek(key);
      if (!object_v.Exists() || object_v != target_v) {
        return false;
      }
    }
  }
  return true;
}